

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::Reference> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Reference>
          (optional<tinyusdz::Reference> *__return_storage_ptr__,MetaVariable *this)

{
  Reference *v;
  
  v = tinyusdz::value::Value::as<tinyusdz::Reference>(&this->_value,false);
  if (v == (Reference *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0x150);
  }
  else {
    __return_storage_ptr__->has_value_ = true;
    nonstd::optional_lite::detail::storage_t<tinyusdz::Reference>::construct_value
              ((storage_t<tinyusdz::Reference> *)&__return_storage_ptr__->contained,v);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }